

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::iterate(FramebufferClearCase *this)

{
  ClearType CVar1;
  pointer log;
  RenderContext *renderCtx;
  Color color;
  Color color_00;
  bool bVar2;
  int iVar3;
  ContextType type;
  GLSLVersion version;
  GLenum GVar4;
  int iVar5;
  undefined4 extraout_var;
  ObjectTraits *pOVar6;
  char *description;
  float depth;
  int iVar7;
  long lVar8;
  int iVar9;
  PixelBufferAccess refAccess;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> refData;
  Renderbuffer depthbuf;
  Renderbuffer colorbuf;
  Framebuffer fbo;
  PixelBufferAccess resAccess;
  Vector<int,_4> res;
  ShaderProgram shader;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  Vector<int,_4> local_3a8;
  TextureFormat local_390;
  GLenum local_388;
  float local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 local_370;
  float local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined4 local_358;
  ConstPixelBufferAccess local_350;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_310;
  ObjectWrapper local_2f8;
  ObjectWrapper local_2e0;
  ObjectWrapper local_2c8;
  ConstPixelBufferAccess local_2b0;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8 [9];
  ShaderProgram local_100;
  Functions *gl;
  
  log = (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  renderCtx = this->m_renderCtx;
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders((ProgramSources *)local_288,version);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pOVar6 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2c8,gl,pOVar6);
  pOVar6 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2e0,gl,pOVar6);
  pOVar6 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_2f8,gl,pOVar6);
  CVar1 = this->m_clearType;
  if (CVar1 == CLEAR_COLOR_FLOAT) {
    local_390.order = RGBA;
    local_390.type = HALF_FLOAT;
    local_3b8 = 0x3e000000;
    local_3b4 = 0x3e800000;
    local_3b0 = 0x3f000000;
    local_3ac = 0x3f800000;
    depth = 0.0;
    local_388 = 0x881a;
  }
  else {
    if (CVar1 == CLEAR_COLOR_INT) {
      local_390.order = RGBA;
      local_390.type = SIGNED_INT32;
      depth = 1.4013e-45;
      local_388 = 0x8d8e;
    }
    else {
      if (CVar1 != CLEAR_COLOR_UINT) {
        local_390.order = RGBA;
        local_390.type = UNORM_INT8;
        local_3b8 = 0x3e000000;
        local_3b4 = 0x3e800000;
        local_3b0 = 0x3f000000;
        local_3ac = 0x3f800000;
        depth = 0.0;
        local_388 = 0x8058;
        goto LAB_01832fab;
      }
      local_390.order = RGBA;
      local_390.type = UNSIGNED_INT32;
      depth = 2.8026e-45;
      local_388 = 0x8d7c;
    }
    local_3ac = 0;
    local_3b0 = 0;
    local_3b4 = 0;
    local_3b8 = 0;
  }
LAB_01832fab:
  local_3a8.m_data[0] = 8;
  local_3a8.m_data[1] = 8;
  local_3a8.m_data[2] = 0x30;
  local_3a8.m_data[3] = 0x30;
  iVar3 = tcu::TextureFormat::getPixelSize(&local_390);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_310,(long)(iVar3 << 0xc),(allocator_type *)local_288);
  iVar3 = tcu::TextureFormat::getPixelSize(&local_390);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_328,(long)(iVar3 << 0xc),(allocator_type *)local_288);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_350,&local_390,0x40,0x40,1,
             local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_2b0,&local_390,0x40,0x40,1,
             local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<((TestLog *)log,&local_100);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader compile/link failed");
  }
  else {
    (*gl->bindFramebuffer)(0x8ca9,local_2c8.m_object);
    (*gl->bindFramebuffer)(0x8ca8,local_2c8.m_object);
    (*gl->bindRenderbuffer)(0x8d41,local_2e0.m_object);
    (*gl->renderbufferStorage)(0x8d41,local_388,0x40,0x40);
    (*gl->framebufferRenderbuffer)(0x8ca9,0x8ce0,0x8d41,local_2e0.m_object);
    (*gl->bindRenderbuffer)(0x8d41,local_2f8.m_object);
    (*gl->renderbufferStorage)(0x8d41,0x88f0,0x40,0x40);
    (*gl->framebufferRenderbuffer)(0x8ca9,0x821a,0x8d41,local_2f8.m_object);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Scissor area is ",0x10);
    tcu::operator<<((ostream *)&uStack_280,&local_3a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Rendering reference (scissors disabled)",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    (*gl->useProgram)(local_100.m_program.m_program);
    iVar3 = 0;
    (*gl->viewport)(0,0,0x40,0x40);
    (*gl->disable)(0xb71);
    (*gl->disable)(0xb90);
    (*gl->disable)(0xc11);
    uStack_364 = local_3b8;
    uStack_360 = local_3b4;
    uStack_35c = local_3b0;
    local_358 = local_3ac;
    color.field_1.i[0] = local_3b8;
    color.type = (Type)depth;
    color.field_1.i[1] = local_3b4;
    color.field_1.i[2] = local_3b0;
    color.field_1.i[3] = local_3ac;
    local_368 = depth;
    clearBuffers(gl,color,depth,iVar3);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
    glu::readPixels(this->m_renderCtx,0,0,(PixelBufferAccess *)&local_350);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x29e);
    local_288 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_280,"Rendering result (scissors enabled)",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
    std::ios_base::~ios_base(local_210);
    (*gl->useProgram)(local_100.m_program.m_program);
    iVar3 = 0;
    (*gl->viewport)(0,0,0x40,0x40);
    (*gl->disable)(0xb71);
    (*gl->disable)(0xb90);
    (*gl->disable)(0xc11);
    uStack_37c = local_3b8;
    uStack_378 = local_3b4;
    uStack_374 = local_3b0;
    local_370 = local_3ac;
    color_00.field_1.i[0] = local_3b8;
    color_00.type = (Type)depth;
    color_00.field_1.i[1] = local_3b4;
    color_00.field_1.i[2] = local_3b0;
    color_00.field_1.i[3] = local_3ac;
    local_380 = depth;
    clearBuffers(gl,color_00,depth,iVar3);
    (*gl->enable)(0xc11);
    (*gl->scissor)(local_3a8.m_data[0],local_3a8.m_data[1],local_3a8.m_data[2],local_3a8.m_data[3]);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
    glu::readPixels(this->m_renderCtx,0,0,(PixelBufferAccess *)&local_2b0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                    ,0x2b4);
    if (depth == 0.0) {
      local_288._4_4_ = local_3b4;
      local_288._0_4_ = local_3b8;
      uStack_280 = (pointer)CONCAT44(local_3ac,local_3b0);
      if (0 < local_350.m_size.m_data[1]) {
        iVar7 = 0;
        iVar3 = local_350.m_size.m_data[1];
        iVar5 = local_350.m_size.m_data[0];
        do {
          if (0 < iVar5) {
            iVar9 = 0;
            do {
              if ((((iVar7 < local_3a8.m_data[1]) ||
                   (local_3a8.m_data[1] + local_3a8.m_data[3] <= iVar7)) ||
                  (iVar9 < local_3a8.m_data[0])) ||
                 (local_3a8.m_data[0] + local_3a8.m_data[2] <= iVar9)) {
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_350,(Vec4 *)local_288,iVar9,iVar7,0);
                iVar5 = local_350.m_size.m_data[0];
              }
              iVar9 = iVar9 + 1;
              iVar3 = local_350.m_size.m_data[1];
            } while (iVar9 < iVar5);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar3);
      }
      local_288 = (undefined1  [8])0x3ca3d70a3ca3d70a;
      uStack_280 = (pointer)0x3ca3d70a3ca3d70a;
      bVar2 = tcu::floatThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",&local_350,
                         &local_2b0,(Vec4 *)local_288,COMPARE_LOG_RESULT);
    }
    else if (depth == 1.4013e-45) {
      local_288._4_4_ = local_3b4;
      local_288._0_4_ = local_3b8;
      uStack_280 = (pointer)CONCAT44(local_3ac,local_3b0);
      Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
                ((PixelBufferAccess *)&local_350,(Vector<int,_4> *)local_288,&local_3a8);
      local_288 = (undefined1  [8])0x200000002;
      uStack_280 = (pointer)0x200000002;
      bVar2 = tcu::intThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",&local_350,
                         &local_2b0,(UVec4 *)local_288,COMPARE_LOG_RESULT);
    }
    else {
      if (0 < local_350.m_size.m_data[1]) {
        iVar7 = 0;
        iVar3 = local_350.m_size.m_data[1];
        iVar5 = local_350.m_size.m_data[0];
        do {
          if (0 < iVar5) {
            iVar9 = 0;
            do {
              if (((iVar7 < local_3a8.m_data[1]) ||
                  (local_3a8.m_data[1] + local_3a8.m_data[3] <= iVar7)) ||
                 ((iVar9 < local_3a8.m_data[0] ||
                  (local_3a8.m_data[0] + local_3a8.m_data[2] <= iVar9)))) {
                local_288._4_4_ = local_3b4;
                local_288._0_4_ = local_3b8;
                uStack_280 = (pointer)CONCAT44(local_3ac,local_3b0);
                tcu::PixelBufferAccess::setPixel
                          ((PixelBufferAccess *)&local_350,(IVec4 *)local_288,iVar9,iVar7,0);
                iVar5 = local_350.m_size.m_data[0];
              }
              iVar9 = iVar9 + 1;
              iVar3 = local_350.m_size.m_data[1];
            } while (iVar9 < iVar5);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar3);
      }
      local_288 = (undefined1  [8])0x200000002;
      uStack_280 = (pointer)0x200000002;
      bVar2 = tcu::intThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",&local_350,
                         &local_2b0,(UVec4 *)local_288,COMPARE_LOG_RESULT);
    }
    if (bVar2 == false) {
      description = "Image comparison failed";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)(bVar2 == false),description);
  }
  if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_310.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&local_2f8);
  glu::ObjectWrapper::~ObjectWrapper(&local_2e0);
  glu::ObjectWrapper::~ObjectWrapper(&local_2c8);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  return STOP;
}

Assistant:

FramebufferClearCase::IterateResult FramebufferClearCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const glu::Framebuffer		fbo				(gl);
	const glu::Renderbuffer		colorbuf		(gl);
	const glu::Renderbuffer		depthbuf		(gl);

	const BufferFmtDesc			bufferFmt		= getBufferFormat(m_clearType);
	const Color					baseColor		= getBaseColor(bufferFmt);

	const int					width			= 64;
	const int					height			= 64;

	const IVec4					scissorArea		(8, 8, 48, 48);

	vector<deUint8>				refData			(width*height*bufferFmt.texFmt.getPixelSize());
	vector<deUint8>				resData			(width*height*bufferFmt.texFmt.getPixelSize());

	tcu::PixelBufferAccess		refAccess		(bufferFmt.texFmt, width, height, 1, &refData[0]);
	tcu::PixelBufferAccess		resAccess		(bufferFmt.texFmt, width, height, 1, &resData[0]);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *fbo);

	// Color
	gl.bindRenderbuffer(GL_RENDERBUFFER, *colorbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, bufferFmt.colorFmt, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorbuf);

	// Depth/stencil
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, *depthbuf);

	log << TestLog::Message << "Scissor area is " << scissorArea << TestLog::EndMessage;

	// Render reference
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, refAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		gl.enable(GL_SCISSOR_TEST);
		gl.scissor(scissorArea.x(), scissorArea.y(), scissorArea.z(), scissorArea.w());

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, resAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	{
		bool resultOk = false;

		switch (baseColor.type)
		{
			case Color::FLOAT:
				clearEdges(refAccess, Vec4(baseColor.f[0], baseColor.f[1], baseColor.f[2], baseColor.f[3]), scissorArea);
				resultOk = tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, Vec4(0.02f, 0.02f, 0.02f, 0.02f), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::INT:
				clearEdges(refAccess, IVec4(baseColor.i[0], baseColor.i[1], baseColor.i[2], baseColor.i[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::UINT:
				clearEdges(refAccess, UVec4(baseColor.u[0], baseColor.u[1], baseColor.u[2], baseColor.u[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;
		}

		if (resultOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}